

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomUniformBlockCase.cpp
# Opt level: O3

int __thiscall
deqp::gls::RandomUniformBlockCase::init(RandomUniformBlockCase *this,EVP_PKEY_CTX *ctx)

{
  uint extraout_EAX;
  deUint32 dVar1;
  uint uVar2;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Random rnd;
  deRandom dStack_38;
  
  deRandom_init(&dStack_38,this->m_seed);
  uVar5 = this->m_maxSharedBlocks;
  iVar3 = 0;
  iVar4 = 0;
  uVar2 = extraout_EAX;
  if (0 < (int)uVar5) {
    dVar1 = deRandom_getUint32(&dStack_38);
    uVar2 = dVar1 / uVar5;
    iVar4 = dVar1 % uVar5 + 1;
  }
  uVar5 = this->m_maxVertexBlocks - iVar4;
  if (0 < (int)uVar5) {
    dVar1 = deRandom_getUint32(&dStack_38);
    uVar2 = dVar1 / uVar5;
    iVar3 = dVar1 % uVar5 + 1;
  }
  uVar5 = this->m_maxFragmentBlocks - iVar4;
  if ((int)uVar5 < 1) {
    iVar6 = 0;
  }
  else {
    dVar1 = deRandom_getUint32(&dStack_38);
    uVar2 = dVar1 / uVar5;
    iVar6 = dVar1 % uVar5 + 1;
  }
  for (; iVar4 != 0; iVar4 = iVar4 + -1) {
    generateBlock(this,(Random *)&dStack_38,0x300);
    uVar2 = extraout_EAX_00;
  }
  if (0 < iVar3) {
    do {
      generateBlock(this,(Random *)&dStack_38,0x100);
      iVar3 = iVar3 + -1;
      uVar2 = extraout_EAX_01;
    } while (iVar3 != 0);
  }
  if (0 < iVar6) {
    do {
      generateBlock(this,(Random *)&dStack_38,0x200);
      iVar6 = iVar6 + -1;
      uVar2 = extraout_EAX_02;
    } while (iVar6 != 0);
  }
  return uVar2;
}

Assistant:

void RandomUniformBlockCase::init (void)
{
	de::Random rnd(m_seed);

	int numShared		= m_maxSharedBlocks				> 0	? rnd.getInt(1, m_maxSharedBlocks)				: 0;
	int numVtxBlocks	= m_maxVertexBlocks-numShared	> 0	? rnd.getInt(1, m_maxVertexBlocks-numShared)	: 0;
	int	numFragBlocks	= m_maxFragmentBlocks-numShared	> 0 ? rnd.getInt(1, m_maxFragmentBlocks-numShared)	: 0;

	for (int ndx = 0; ndx < numShared; ndx++)
		generateBlock(rnd, DECLARE_VERTEX|DECLARE_FRAGMENT);

	for (int ndx = 0; ndx < numVtxBlocks; ndx++)
		generateBlock(rnd, DECLARE_VERTEX);

	for (int ndx = 0; ndx < numFragBlocks; ndx++)
		generateBlock(rnd, DECLARE_FRAGMENT);
}